

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O3

bool uWS::WebSocketProtocol<true,uWS::WebSocketContext<false,true>>::
     consumeMessage<8u,unsigned_short>
               (unsigned_short payLength,char **src,uint *length,WebSocketState<true> *wState,
               void *user)

{
  char cVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  OpCode OVar7;
  bool bVar8;
  long lVar9;
  char *pcVar10;
  byte bVar11;
  OpCode OVar12;
  uint uVar13;
  
  OVar12 = **src;
  OVar7 = *(OpCode *)&wState->state;
  if ((OVar12 & 0xf) == 0) {
    if ((OVar7 & 0x60) == 0x60) goto LAB_00142e37;
  }
  else {
    if (((OVar7 & 0x60) == 0x20) || ((OVar12 & 0xf) == TEXT && -1 < (char)OVar7)) goto LAB_00142e37;
    bVar11 = (OVar7 >> 5) + 1;
    OVar7 = OVar7 & 0x9f | (bVar11 & 3) << 5;
    *(OpCode *)&wState->state = OVar7;
    (wState->state).opCode[(long)((ulong)bVar11 << 0x3e) >> 0x3e] = OVar12 & 0xf;
    OVar12 = **src;
  }
  *(OpCode *)&wState->state = OVar7 & 0x7f | OVar12 & 0x80;
  us_socket_context(0,user);
  lVar9 = us_socket_context_ext(0);
  if ((ulong)payLength <= *(ulong *)(lVar9 + 0xa0)) {
    uVar13 = payLength + 8;
    if (*length < uVar13) {
      *(byte *)&wState->state = *(byte *)&wState->state & 0xe0;
      wState->remainingBytes = uVar13 - *length;
      bVar11 = **src;
      *(undefined4 *)wState->mask = *(undefined4 *)(*src + 4);
      pcVar10 = *src;
      uVar13 = *length;
      lVar9 = 0;
      do {
        pcVar10[lVar9 * 4] = wState->mask[0] ^ pcVar10[lVar9 * 4 + 8];
        pcVar10[lVar9 * 4 + 1] = wState->mask[1] ^ pcVar10[lVar9 * 4 + 9];
        pcVar10[lVar9 * 4 + 2] = wState->mask[2] ^ pcVar10[lVar9 * 4 + 10];
        pcVar10[lVar9 * 4 + 3] = wState->mask[3] ^ pcVar10[lVar9 * 4 + 0xb];
        lVar9 = lVar9 + 1;
      } while ((uVar13 - 8 >> 2) + 1 != (int)lVar9);
      uVar13 = *length;
      cVar1 = wState->mask[1];
      cVar2 = wState->mask[2];
      cVar3 = wState->mask[3];
      wState->mask[-uVar13 & 3] = wState->mask[0];
      wState->mask[1 - uVar13 & 3] = cVar1;
      wState->mask[(ulong)(-uVar13 & 3) ^ 2] = cVar2;
      wState->mask[~uVar13 & 3] = cVar3;
      WebSocketContext<false,_true>::handleFragment
                (*src,(ulong)(*length - 8),wState->remainingBytes,
                 (uint)(wState->state).opCode[(char)(*(char *)&wState->state * '\x02') >> 6],
                 (bool)(bVar11 >> 7),wState,user);
      return true;
    }
    pcVar10 = *src;
    bVar11 = pcVar10[4];
    bVar4 = pcVar10[5];
    bVar5 = pcVar10[6];
    bVar6 = pcVar10[7];
    lVar9 = 0;
    do {
      pcVar10[lVar9 * 4 + 4] = pcVar10[lVar9 * 4 + 8] ^ bVar11;
      pcVar10[lVar9 * 4 + 5] = pcVar10[lVar9 * 4 + 9] ^ bVar4;
      pcVar10[lVar9 * 4 + 6] = pcVar10[lVar9 * 4 + 10] ^ bVar5;
      pcVar10[lVar9 * 4 + 7] = pcVar10[lVar9 * 4 + 0xb] ^ bVar6;
      lVar9 = lVar9 + 1;
    } while ((payLength >> 2) + 1 != (int)lVar9);
    bVar8 = WebSocketContext<false,_true>::handleFragment
                      (*src + 4,(ulong)payLength,0,
                       (uint)(wState->state).opCode[(char)(*(char *)&wState->state * '\x02') >> 6],
                       (bool)((byte)**src >> 7),wState,user);
    if (!bVar8) {
      pcVar10 = *src;
      if (*pcVar10 < '\0') {
        *(byte *)&wState->state =
             *(byte *)&wState->state & 0x9f | *(byte *)&wState->state + 0x60 & 0x60;
        pcVar10 = *src;
      }
      *src = pcVar10 + uVar13;
      *length = *length - uVar13;
      *(byte *)&wState->state = *(byte *)&wState->state & 0xe1;
      return false;
    }
    return true;
  }
LAB_00142e37:
  us_socket_close(0,user);
  return true;
}

Assistant:

static inline bool consumeMessage(T payLength, char *&src, unsigned int &length, WebSocketState<isServer> *wState, void *user) {
        if (getOpCode(src)) {
            if (wState->state.opStack == 1 || (!wState->state.lastFin && getOpCode(src) < 2)) {
                Impl::forceClose(wState, user);
                return true;
            }
            wState->state.opCode[++wState->state.opStack] = (OpCode) getOpCode(src);
        } else if (wState->state.opStack == -1) {
            Impl::forceClose(wState, user);
            return true;
        }
        wState->state.lastFin = isFin(src);

        if (Impl::refusePayloadLength(payLength, wState, user)) {
            Impl::forceClose(wState, user);
            return true;
        }

        if (payLength + MESSAGE_HEADER <= length) {
            if (isServer) {
                unmaskImpreciseCopyMask(src + MESSAGE_HEADER - 4, src + MESSAGE_HEADER, src + MESSAGE_HEADER - 4, (unsigned int) payLength);
                if (Impl::handleFragment(src + MESSAGE_HEADER - 4, payLength, 0, wState->state.opCode[wState->state.opStack], isFin(src), wState, user)) {
                    return true;
                }
            } else {
                if (Impl::handleFragment(src + MESSAGE_HEADER, payLength, 0, wState->state.opCode[wState->state.opStack], isFin(src), wState, user)) {
                    return true;
                }
            }

            if (isFin(src)) {
                wState->state.opStack--;
            }

            src += payLength + MESSAGE_HEADER;
            length -= (unsigned int) (payLength + MESSAGE_HEADER);
            wState->state.spillLength = 0;
            return false;
        } else {
            wState->state.spillLength = 0;
            wState->state.wantsHead = false;
            wState->remainingBytes = (unsigned int) (payLength - length + MESSAGE_HEADER);
            bool fin = isFin(src);
            if (isServer) {
                memcpy(wState->mask, src + MESSAGE_HEADER - 4, 4);
                unmaskImprecise(src, src + MESSAGE_HEADER, wState->mask, length - MESSAGE_HEADER);
                rotateMask(4 - (length - MESSAGE_HEADER) % 4, wState->mask);
            } else {
                src += MESSAGE_HEADER;
            }
            Impl::handleFragment(src, length - MESSAGE_HEADER, wState->remainingBytes, wState->state.opCode[wState->state.opStack], fin, wState, user);
            return true;
        }
    }